

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context-decls.cpp
# Opt level: O0

Result<wasm::Memory_*> * __thiscall
wasm::WATParser::ParseDeclsCtx::addMemoryDecl
          (Result<wasm::Memory_*> *__return_storage_ptr__,ParseDeclsCtx *this,Index pos,Name name,
          ImportNames *importNames,MemType type)

{
  int __val;
  Name root;
  Name name_;
  Name name_00;
  uint64_t a;
  bool bVar1;
  pointer pMVar2;
  unsigned_long *puVar3;
  Memory *pMVar4;
  type item;
  char *__lhs;
  uint64_t local_178;
  Memory *local_140;
  ParseDeclsCtx *local_138;
  size_t sStack_130;
  string_view local_128;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  Name local_d8;
  ParseDeclsCtx *local_c8;
  size_t sStack_c0;
  undefined4 local_b0;
  allocator<char> local_a9;
  string local_a8;
  Err local_88;
  ParseDeclsCtx *local_68;
  size_t sStack_60;
  unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> local_40;
  __single_object m;
  ImportNames *importNames_local;
  Index pos_local;
  ParseDeclsCtx *this_local;
  Name name_local;
  
  name_local.super_IString.str._M_len = name.super_IString.str._M_str;
  this_local = name.super_IString.str._M_len;
  m._M_t.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
  super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::Memory,_std::default_delete<wasm::Memory>,_true,_true>)
       (__uniq_ptr_data<wasm::Memory,_std::default_delete<wasm::Memory>,_true,_true>)importNames;
  name_local.super_IString.str._M_str = (char *)__return_storage_ptr__;
  std::make_unique<wasm::Memory>();
  pMVar2 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(&local_40);
  (pMVar2->addressType).id = type.addressType.id;
  a = type.limits.initial;
  pMVar2 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(&local_40);
  wasm::Address::operator=(&pMVar2->initial,a);
  bVar1 = std::optional::operator_cast_to_bool((optional *)&type.limits.max);
  if (bVar1) {
    puVar3 = std::optional<unsigned_long>::operator*(&type.limits.max);
    local_178 = *puVar3;
  }
  else {
    local_178 = 0xffffffffffffffff;
  }
  pMVar2 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(&local_40);
  wasm::Address::operator=(&pMVar2->max,local_178);
  bVar1 = type.shared;
  pMVar2 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(&local_40);
  pMVar2->shared = (bool)(bVar1 & 1);
  bVar1 = IString::operator_cast_to_bool((IString *)&this_local);
  if (bVar1) {
    local_68 = this_local;
    sStack_60 = name_local.super_IString.str._M_len;
    name_00.super_IString.str._M_str = (char *)name_local.super_IString.str._M_len;
    name_00.super_IString.str._M_len = (size_t)this_local;
    pMVar4 = Module::getMemoryOrNull(this->wasm,name_00);
    if (pMVar4 != (Memory *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,"repeated memory name",&local_a9);
      Lexer::err(&local_88,&this->in,(ulong)pos,&local_a8);
      Result<wasm::Memory_*>::Result(__return_storage_ptr__,&local_88);
      wasm::Err::~Err(&local_88);
      std::__cxx11::string::~string((string *)&local_a8);
      std::allocator<char>::~allocator(&local_a9);
      goto LAB_02310755;
    }
    pMVar2 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                       (&local_40);
    local_c8 = this_local;
    sStack_c0 = name_local.super_IString.str._M_len;
    name_.super_IString.str._M_str = (char *)name_local.super_IString.str._M_len;
    name_.super_IString.str._M_len = (size_t)this_local;
    Named::setExplicitName((Named *)pMVar2,name_);
  }
  else {
    __lhs = "";
    if ((__uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>)
        m._M_t.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
        super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
        super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>)0x0) {
      __lhs = "mimport$";
    }
    __val = this->memoryCounter;
    this->memoryCounter = __val + 1;
    std::__cxx11::to_string(&local_118,__val);
    std::operator+(&local_f8,__lhs,&local_118);
    wasm::Name::Name(&local_d8,&local_f8);
    wasm::Name::operator=((Name *)&this_local,&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    local_138 = this_local;
    sStack_130 = name_local.super_IString.str._M_len;
    root.super_IString.str._M_str = (char *)name_local.super_IString.str._M_len;
    root.super_IString.str._M_len = (size_t)this_local;
    local_128 = (string_view)Names::getValidMemoryName(this->wasm,root);
    wasm::Name::operator=((Name *)&this_local,(Name *)&local_128);
    pMVar2 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                       (&local_40);
    wasm::Name::operator=((Name *)pMVar2,(Name *)&this_local);
  }
  item = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator*(&local_40);
  anon_unknown_5::applyImportNames
            (&item->super_Importable,
             (ImportNames *)
             m._M_t.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
             super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl);
  local_140 = Module::addMemory(this->wasm,&local_40);
  Result<wasm::Memory*>::Result<wasm::Memory*>
            ((Result<wasm::Memory*> *)__return_storage_ptr__,&local_140);
LAB_02310755:
  local_b0 = 1;
  std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::~unique_ptr(&local_40);
  return __return_storage_ptr__;
}

Assistant:

Result<Memory*> ParseDeclsCtx::addMemoryDecl(Index pos,
                                             Name name,
                                             ImportNames* importNames,
                                             MemType type) {
  auto m = std::make_unique<Memory>();
  m->addressType = type.addressType;
  m->initial = type.limits.initial;
  m->max = type.limits.max ? *type.limits.max : Memory::kUnlimitedSize;
  m->shared = type.shared;
  if (name) {
    // TODO: if the existing memory is not explicitly named, fix its name
    // and continue.
    if (wasm.getMemoryOrNull(name)) {
      return in.err(pos, "repeated memory name");
    }
    m->setExplicitName(name);
  } else {
    name = (importNames ? "mimport$" : "") + std::to_string(memoryCounter++);
    name = Names::getValidMemoryName(wasm, name);
    m->name = name;
  }
  applyImportNames(*m, importNames);
  return wasm.addMemory(std::move(m));
}